

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

float32 helper_recpe_f32_aarch64(float32 input,void *fpstp)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  float32 fVar4;
  uint64_t uVar5;
  float32 local_44;
  float32 nan;
  uint64_t f64_frac;
  uint32_t local_30;
  uint32_t f32_frac;
  int f32_exp;
  float32 fStack_24;
  _Bool f32_sign;
  uint32_t f32_val;
  float32 f32;
  float_status *fpst;
  void *fpstp_local;
  float32 input_local;
  
  _f32_val = (float_status *)fpstp;
  fpst = (float_status *)fpstp;
  fpstp_local._0_4_ = input;
  f32_exp = float32_squash_input_denormal_aarch64(input,(float_status *)fpstp);
  fStack_24 = f32_exp;
  iVar2 = float32_is_neg(f32_exp);
  f32_frac._3_1_ = iVar2 != 0;
  local_30 = extract32(f32_exp,0x17,8);
  uVar3 = extract32(f32_exp,0,0x17);
  iVar2 = float32_is_any_nan(fStack_24);
  if (iVar2 == 0) {
    iVar2 = float32_is_infinity(fStack_24);
    if (iVar2 == 0) {
      iVar2 = float32_is_zero(fStack_24);
      if (iVar2 == 0) {
        fVar4 = float32_abs(fStack_24);
        if (fVar4 < 0x200000) {
          float_raise_aarch64('(',_f32_val);
          _Var1 = round_to_inf(_f32_val,(_Bool)(f32_frac._3_1_ & 1));
          if (_Var1) {
            fpstp_local._4_4_ = float32_set_sign(0x7f800000,(uint)(f32_frac._3_1_ & 1));
          }
          else {
            fpstp_local._4_4_ = float32_set_sign(0x7f7fffff,(uint)(f32_frac._3_1_ & 1));
          }
        }
        else if (((int)local_30 < 0xfd) || (_f32_val->flush_to_zero == '\0')) {
          uVar5 = call_recip_estimate((int *)&local_30,0xfd,(ulong)uVar3 << 0x1d);
          f32_exp = deposit32(0,0x1f,1,(uint)(f32_frac._3_1_ & 1));
          uVar3 = deposit32(f32_exp,0x17,8,local_30);
          f32_exp = uVar3;
          uVar5 = extract64(uVar5,0x1d,0x17);
          fpstp_local._4_4_ = deposit32(uVar3,0,0x17,(uint32_t)uVar5);
        }
        else {
          float_raise_aarch64('\x10',_f32_val);
          iVar2 = float32_is_neg(fStack_24);
          fpstp_local._4_4_ = float32_set_sign(0,iVar2);
        }
      }
      else {
        float_raise_aarch64('\x04',_f32_val);
        iVar2 = float32_is_neg(fStack_24);
        fpstp_local._4_4_ = float32_set_sign(0x7f800000,iVar2);
      }
    }
    else {
      iVar2 = float32_is_neg(fStack_24);
      fpstp_local._4_4_ = float32_set_sign(0,iVar2);
    }
  }
  else {
    local_44 = fStack_24;
    iVar2 = float32_is_signaling_nan_aarch64(fStack_24,_f32_val);
    if (iVar2 != 0) {
      float_raise_aarch64('\x01',_f32_val);
      local_44 = float32_silence_nan_aarch64(fStack_24,_f32_val);
    }
    if (_f32_val->default_nan_mode != '\0') {
      local_44 = float32_default_nan_aarch64(_f32_val);
    }
    fpstp_local._4_4_ = local_44;
  }
  return fpstp_local._4_4_;
}

Assistant:

float32 HELPER(recpe_f32)(float32 input, void *fpstp)
{
    float_status *fpst = fpstp;
    float32 f32 = float32_squash_input_denormal(input, fpst);
    uint32_t f32_val = float32_val(f32);
    bool f32_sign = float32_is_neg(f32);
    int f32_exp = extract32(f32_val, 23, 8);
    uint32_t f32_frac = extract32(f32_val, 0, 23);
    uint64_t f64_frac;

    if (float32_is_any_nan(f32)) {
        float32 nan = f32;
        if (float32_is_signaling_nan(f32, fpst)) {
            float_raise(float_flag_invalid, fpst);
            nan = float32_silence_nan(f32, fpst);
        }
        if (fpst->default_nan_mode) {
            nan =  float32_default_nan(fpst);
        }
        return nan;
    } else if (float32_is_infinity(f32)) {
        return float32_set_sign(float32_zero, float32_is_neg(f32));
    } else if (float32_is_zero(f32)) {
        float_raise(float_flag_divbyzero, fpst);
        return float32_set_sign(float32_infinity, float32_is_neg(f32));
    } else if (float32_abs(f32) < (1ULL << 21)) {
        /* Abs(value) < 2.0^-128 */
        float_raise(float_flag_overflow | float_flag_inexact, fpst);
        if (round_to_inf(fpst, f32_sign)) {
            return float32_set_sign(float32_infinity, f32_sign);
        } else {
            return float32_set_sign(float32_maxnorm, f32_sign);
        }
    } else if (f32_exp >= 253 && fpst->flush_to_zero) {
        float_raise(float_flag_underflow, fpst);
        return float32_set_sign(float32_zero, float32_is_neg(f32));
    }

    f64_frac = call_recip_estimate(&f32_exp, 253,
                                   ((uint64_t) f32_frac) << (52 - 23));

    /* result = sign : result_exp<7:0> : fraction<51:29> */
    f32_val = deposit32(0, 31, 1, f32_sign);
    f32_val = deposit32(f32_val, 23, 8, f32_exp);
    f32_val = deposit32(f32_val, 0, 23, extract64(f64_frac, 52 - 23, 23));
    return make_float32(f32_val);
}